

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.c
# Opt level: O1

void MemoryStream_SetPosition
               (MemoryStream *memory_stream,ptrdiff_t offset,MemoryStream_Origin origin)

{
  if (origin == MEMORYSTREAM_END) {
    offset = offset + memory_stream->end;
  }
  else {
    if (origin == MEMORYSTREAM_CURRENT) {
      memory_stream->position = memory_stream->position + offset;
      return;
    }
    if (origin != MEMORYSTREAM_START) {
      return;
    }
  }
  memory_stream->position = offset;
  return;
}

Assistant:

void MemoryStream_SetPosition(MemoryStream *memory_stream, ptrdiff_t offset, enum MemoryStream_Origin origin)
{
	switch (origin)
	{
		case MEMORYSTREAM_START:
			memory_stream->position = (size_t)offset;
			break;
		case MEMORYSTREAM_CURRENT:
			memory_stream->position = (size_t)(memory_stream->position + offset);
			break;
		case MEMORYSTREAM_END:
			memory_stream->position = (size_t)(memory_stream->end + offset);
			break;
	}
}